

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cc
# Opt level: O3

void __thiscall Filter::set_w0(Filter *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (int)((double)this->f0[this->fc] * 6.283185307179586 * 1.048576);
  this->w0 = iVar1;
  iVar2 = 0x19bc6;
  if (iVar1 < 0x19bc6) {
    iVar2 = iVar1;
  }
  this->w0_ceil_1 = iVar2;
  iVar2 = 0x66f1;
  if (iVar1 < 0x66f1) {
    iVar2 = iVar1;
  }
  this->w0_ceil_dt = iVar2;
  return;
}

Assistant:

void Filter::set_w0()
{
  const double pi = 3.1415926535897932385;

  // Multiply with 1.048576 to facilitate division by 1 000 000 by right-
  // shifting 20 times (2 ^ 20 = 1048576).
  w0 = static_cast<sound_sample>(2*pi*f0[fc]*1.048576);

  // Limit f0 to 16kHz to keep 1 cycle filter stable.
  const sound_sample w0_max_1 = static_cast<sound_sample>(2*pi*16000*1.048576);
  w0_ceil_1 = w0 <= w0_max_1 ? w0 : w0_max_1;

  // Limit f0 to 4kHz to keep delta_t cycle filter stable.
  const sound_sample w0_max_dt = static_cast<sound_sample>(2*pi*4000*1.048576);
  w0_ceil_dt = w0 <= w0_max_dt ? w0 : w0_max_dt;
}